

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void eig22(double *A,int stride,double *eigre,double *eigim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double at22;
  double at21;
  double at12;
  double at11;
  double t2;
  double t;
  double t1;
  double cs;
  double s2;
  double c2;
  double s;
  double c;
  double a22;
  double a21;
  double a12;
  double a11;
  int N;
  double *eigim_local;
  double *eigre_local;
  int stride_local;
  double *A_local;
  
  dVar8 = *A;
  dVar9 = A[1];
  dVar1 = A[stride];
  dVar2 = A[stride + 1];
  if ((dVar9 + dVar1 != 0.0) || (NAN(dVar9 + dVar1))) {
    dVar4 = (dVar8 - dVar2) / (dVar9 + dVar1);
    dVar3 = sqrt(dVar4 * dVar4 + 1.0);
    dVar4 = dVar4 / (dVar3 + 1.0);
    dVar3 = sqrt(dVar4 * dVar4 + 1.0);
    s = 1.0 / dVar3;
    c2 = s * dVar4;
  }
  else {
    dVar3 = sqrt(2.0);
    c2 = 1.0 / dVar3;
    s = c2;
  }
  dVar3 = s * s;
  dVar4 = c2 * c2;
  dVar5 = s * c2;
  dVar6 = -dVar5 * (dVar9 + dVar1) + dVar3 * dVar8 + dVar4 * dVar2;
  dVar7 = dVar5 * (dVar8 - dVar2) + dVar3 * dVar9 + -(dVar4 * dVar1);
  dVar8 = dVar5 * (dVar8 - dVar2) + dVar3 * dVar1 + -(dVar4 * dVar9);
  eigre[1] = dVar6;
  *eigre = dVar6;
  dVar9 = sqrt(-dVar7 * dVar8);
  *eigim = dVar9;
  dVar9 = sqrt(-dVar7 * dVar8);
  eigim[1] = -dVar9;
  if (0.0 <= dVar7 * dVar8) {
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      dVar9 = sqrt(dVar8 / dVar7);
      t1 = dVar9 / (dVar9 * dVar9 + 1.0);
    }
    else {
      t1 = 0.0;
    }
    eigim[1] = 0.0;
    *eigim = 0.0;
    *eigre = -t1 * (dVar7 + dVar8) + dVar6;
    eigre[1] = t1 * (dVar7 + dVar8) + dVar6;
  }
  return;
}

Assistant:

void eig22(double *A, int stride,double *eigre,double *eigim) {
	int N;
	double a11,a12,a21,a22,c,s,c2,s2,cs,t1,t,t2,at11,at12,at21,at22;
	N = stride;
	
	a11 = A[0];
	a12 = A[1];
	a21 = A[N];
	a22 = A[N+1];
	
	if ( (a12 + a21) == 0) {
		c = 1./sqrt(2.0);
		s = c;
	} else {
		t1 = (a11 - a22) / (a12 + a21);
		t = t1 /(1. + sqrt(1+t1*t1));
		c = 1./sqrt(1 + t*t);
		s = c*t;
	}
	
	c2 = c*c;
	s2 = s*s;
	cs = c*s;

	at11 = c2 * a11 + s2 * a22 - cs * (a12 + a21);
	at12 = c2 * a12 - s2 * a21 + cs * (a11 - a22);
	at21 = c2 * a21 - s2 * a12 + cs * (a11 - a22);
	at22 = c2 * a22 + s2 * a11 + cs * (a12 + a21);
	
	eigre[0] = eigre[1] = at11;
	eigim[0] = sqrt(-at12 * at21);
	eigim[1] = -sqrt(-at12 * at21);
	
	if ( at12*at21 >= 0) {
		if (at12 == 0) {
			c = 0;
			s = 1;
			c2 = 0;
			s2 = 1;
			cs = 0;
		} else {
			t = sqrt(at21/at12);
			t2 = t * t;
			cs = t/(1+t2);
			c2 = (1+t2);
			s2 = t2 /(1+t2);
		}
		eigim[0] = eigim[1] = 0.0;
		eigre[0] = at11 - cs * (at12 + at21);
		eigre[1] = at11 + cs * (at12 + at21);
		
	}
	
}